

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void __thiscall Portal::update(Portal *this,int currentTimeInMillis)

{
  int iVar1;
  int elapsedTimeInMillis;
  int currentTimeInMillis_local;
  Portal *this_local;
  
  iVar1 = piksel::Timer::getElapsedTimeInMillis(&this->timer,currentTimeInMillis);
  switch(this->state) {
  case CLOSED:
    break;
  case OPENING:
    if ((float)iVar1 <= 350.0) {
      this->scale = (float)iVar1 / 350.0;
    }
    else {
      this->state = OPEN;
    }
    break;
  case OPEN:
    close(this,currentTimeInMillis);
    break;
  case CLOSING:
    if ((float)iVar1 <= 350.0) {
      this->scale = (350.0 - (float)iVar1) / 350.0;
    }
    else {
      this->state = CLOSED;
    }
  }
  return;
}

Assistant:

void Portal::update(int currentTimeInMillis) {
    int elapsedTimeInMillis = timer.getElapsedTimeInMillis(currentTimeInMillis);
    switch (state) {
        case CLOSED:
            break;
        case OPENING:
            if (elapsedTimeInMillis > PORTAL_DURATION) {
                state = OPEN;
            } else {
                scale = elapsedTimeInMillis / PORTAL_DURATION;
            }
            break;
        case OPEN:
            close(currentTimeInMillis);
            break;
        case CLOSING:
            if (elapsedTimeInMillis > PORTAL_DURATION) {
                state = CLOSED;
            } else {
                scale = (PORTAL_DURATION - elapsedTimeInMillis) / PORTAL_DURATION;
            }
            break;
    }
}